

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.hpp
# Opt level: O2

error_or_n<typename_buffered_reader<descriptor<posix_descriptor_traits>_&,_error_or<pair<descriptor<posix_descriptor_traits>_&,_span_iterator<span<unsigned_char>,_false>_>_>_(*)(descriptor<posix_descriptor_traits>_&,_const_span<unsigned_char>_&)>::state_type,_request_info>
* __thiscall
pstore::http::
read_request<pstore::http::buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,_1l>const&)>>
          (error_or_n<typename_buffered_reader<descriptor<posix_descriptor_traits>_&,_error_or<pair<descriptor<posix_descriptor_traits>_&,_span_iterator<span<unsigned_char>,_false>_>_>_(*)(descriptor<posix_descriptor_traits>_&,_const_span<unsigned_char>_&)>::state_type,_request_info>
           *__return_storage_ptr__,http *this,
          buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
          *reader,state_type io)

{
  anon_class_1_0_00000001 extract_request_info;
  anon_class_1_0_00000001 check_for_eof;
  anon_class_1_0_00000001 local_7a;
  anon_class_1_0_00000001 local_79;
  result_type_conflict local_78;
  error_or_n<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::maybe<std::__cxx11::basic_string<char>_>_>
  local_48;
  
  buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,-1l>const&)>
  ::gets_abi_cxx11_((buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,_1l>const&)>
                     *)&local_48,(char *)this);
  pstore::operator>>=(&local_78,&local_48,&local_79);
  pstore::operator>>=(__return_storage_ptr__,&local_78,&local_7a);
  error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~error_or(&local_78);
  error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
  ::~error_or(&local_48);
  return __return_storage_ptr__;
}

Assistant:

error_or_n<typename Reader::state_type, request_info>
        read_request (Reader & reader, typename Reader::state_type io) {
            using state_type = typename Reader::state_type;

            auto check_for_eof = [] (state_type io2, maybe<std::string> const & buf) {
                using result_type = error_or_n<state_type, std::string>;
                if (!buf) {
                    return result_type{details::out_of_data_error ()};
                }
                return result_type{in_place, io2, *buf};
            };

            auto extract_request_info = [] (state_type io3, std::string const & s) {
                using result_type = error_or_n<state_type, request_info>;

                std::istringstream is{s};
                std::string method;
                std::string uri;
                std::string version;
                is >> method >> uri >> version;
                if (method.length () == 0 || uri.length () == 0 || version.length () == 0) {
                    return result_type{details::out_of_data_error ()};
                }
                return result_type{
                    in_place, io3,
                    request_info{std::move (method), std::move (uri), std::move (version)}};
            };

            return (reader.gets (io) >>= check_for_eof) >>= extract_request_info;
        }